

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O0

void hooked_curses_getlin(char *query,char *buf,getlin_hook_proc hook,void *hook_proc_arg)

{
  WINDOW_conflict *pWVar1;
  int local_64;
  char **ppcStack_60;
  wchar_t output_count;
  char **output;
  nh_bool autocomplete;
  size_t sStack_50;
  nh_bool done;
  size_t len;
  wchar_t prev_curs;
  wchar_t key;
  wchar_t width;
  wchar_t height;
  win_getline *gldat;
  gamewin *gw;
  void *hook_proc_arg_local;
  getlin_hook_proc hook_local;
  char *buf_local;
  char *query_local;
  
  sStack_50 = 0;
  output._7_1_ = '\0';
  output._6_1_ = '\0';
  gw = (gamewin *)hook_proc_arg;
  hook_proc_arg_local = hook;
  hook_local = (getlin_hook_proc)buf;
  buf_local = query;
  len._0_4_ = curs_set(1);
  ui_wrap_text(0x4c,buf_local,&local_64,&stack0xffffffffffffffa0);
  ui_free_wrap(ppcStack_60);
  key = local_64 + L'\x03';
  prev_curs = L'P';
  gldat = (win_getline *)alloc_gamewin(L'\x18');
  pWVar1 = newdialog(key,prev_curs);
  *(WINDOW_conflict **)&gldat->pos = pWVar1;
  gldat->buf = (char *)draw_getline;
  gldat->query = (char *)resize_getline;
  _width = &gldat[1].pos;
  *(getlin_hook_proc *)_width = hook_local;
  gldat[2].buf = buf_local;
  *hook_local = (_func_nh_bool_char_ptr_void_ptr)0x0;
LAB_0010a9ef:
  do {
    while( true ) {
      if (output._7_1_ != '\0') {
        curs_set((undefined4)len);
        delwin(*(undefined8 *)&gldat->pos);
        delete_gamewin((gamewin *)gldat);
        redraw_game_windows();
        return;
      }
      draw_getline((gamewin *)gldat);
      len._4_4_ = nh_wgetch(*(WINDOW_conflict **)&gldat->pos);
      if (len._4_4_ != L'\r') break;
LAB_0010aac6:
      output._7_1_ = '\x01';
    }
    if (len._4_4_ != L'\x1b') {
      if (len._4_4_ == L'\x7f') {
LAB_0010aacf:
        if (_width[4] == 0) goto LAB_0010a9ef;
        _width[4] = _width[4] + -1;
      }
      else {
        if (len._4_4_ == L'Ą') {
          if (0 < _width[4]) {
            _width[4] = _width[4] + -1;
          }
          goto LAB_0010a9ef;
        }
        if (len._4_4_ == L'ą') {
          if ((ulong)(long)_width[4] < sStack_50) {
            _width[4] = _width[4] + 1;
          }
          goto LAB_0010a9ef;
        }
        if (len._4_4_ == L'Ć') {
          _width[4] = 0;
          goto LAB_0010a9ef;
        }
        if (len._4_4_ == L'ć') goto LAB_0010aacf;
        if (len._4_4_ != L'Ŋ') {
          if (len._4_4_ == L'ŗ') goto LAB_0010aac6;
          if (len._4_4_ == L'Ũ') {
            _width[4] = (int)sStack_50;
          }
          else if ((((0x1f < (uint)len._4_4_) && ((uint)len._4_4_ < 0x80)) && (len._4_4_ != L'\x7f')
                   ) && (_width[4] < 0xfe)) {
            buf_insert((char *)hook_local,_width[4],(char)len._4_4_);
            _width[4] = _width[4] + 1;
            sStack_50 = sStack_50 + 1;
            if (hook_proc_arg_local == (void *)0x0) {
              output._6_1_ = '\0';
            }
            else {
              if (output._6_1_ != '\0') {
                hook_local[_width[4]] = (_func_nh_bool_char_ptr_void_ptr)0x0;
              }
              output._6_1_ = (*(code *)hook_proc_arg_local)(hook_local,gw);
              sStack_50 = strlen((char *)hook_local);
            }
          }
          goto LAB_0010a9ef;
        }
      }
      if (sStack_50 != 0) {
        sStack_50 = sStack_50 - 1;
        buf_delete((char *)hook_local,_width[4]);
      }
      goto LAB_0010a9ef;
    }
    *hook_local = (_func_nh_bool_char_ptr_void_ptr)(char)len._4_4_;
    hook_local[1] = (code)0x0;
    output._7_1_ = '\x01';
  } while( true );
}

Assistant:

static void hooked_curses_getlin(const char *query, char *buf,
		       getlin_hook_proc hook, void *hook_proc_arg)
{
    struct gamewin *gw;
    struct win_getline *gldat;
    int height, width, key, prev_curs;
    size_t len = 0;
    nh_bool done = FALSE;
    nh_bool autocomplete = FALSE;
    char **output;
    int output_count;

    prev_curs = curs_set(1);

    /* wrap text just for determining dimensions */
    ui_wrap_text(COLNO - 4, query, &output_count, &output);
    ui_free_wrap(output);
    height = output_count + 3;
    width = COLNO;

    gw = alloc_gamewin(sizeof(struct win_getline));
    gw->win = newdialog(height, width);
    gw->draw = draw_getline;
    gw->resize = resize_getline;
    gldat = (struct win_getline *)gw->extra;
    gldat->buf = buf;
    gldat->query = query;
    
    buf[0] = 0;
    while (!done) {
	draw_getline(gw);
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    case KEY_ESC:
		buf[0] = (char)key;
		buf[1] = 0;
		done = TRUE;
		break;
		
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;

	    case KEY_BACKSPACE: /* different terminals send different codes... */
	    case KEY_BACKDEL:
		if (gldat->pos == 0) continue;
		gldat->pos--;
		/* fall through */
	    case KEY_DC:
		if (len == 0) continue;
		len--;
		buf_delete(buf, gldat->pos);
		break;
		
	    case KEY_LEFT:
		if (gldat->pos > 0) gldat->pos--;
		break;
		
	    case KEY_RIGHT:
		if (gldat->pos < len) gldat->pos++;
		break;
		
	    case KEY_HOME:
		gldat->pos = 0;
		break;
		
	    case KEY_END:
		gldat->pos = len;
		break;
		
	    default:
		if (' ' > (unsigned) key || (unsigned)key >= 128 || 
		    key == KEY_BACKDEL || gldat->pos >= BUFSZ-2)
		    continue;
		buf_insert(buf, gldat->pos, key);
		gldat->pos++;
		len++;
		
		if (hook) {
		    if (autocomplete)
			/* discard previous completion before looking for a new one */
			buf[gldat->pos] = '\0';
		    
		    autocomplete = (*hook)(buf, hook_proc_arg);
		    len = strlen(buf); /* (*hook) may modify buf */
		} else
		    autocomplete = FALSE;
		
		break;
	}
    }
    
    curs_set(prev_curs);
    
    delwin(gw->win);
    delete_gamewin(gw);
    redraw_game_windows();
}